

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::equalsn
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_short *str1,
          unsigned_short *str2,int len)

{
  unsigned_short uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  unsigned_short uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = *str1;
  bVar6 = uVar1 == 0;
  if ((bVar6) || (uVar5 = *str2, len < 1 || uVar5 == 0)) {
    iVar2 = 0;
    lVar3 = 0;
  }
  else {
    lVar4 = 0;
    do {
      if (uVar1 != uVar5) {
        return false;
      }
      lVar3 = lVar4 + 1;
      uVar1 = str1[lVar4 + 1];
      bVar6 = uVar1 == 0;
    } while (((!bVar6) && (lVar3 < len)) && (uVar5 = str2[lVar4 + 1], lVar4 = lVar3, uVar5 != 0));
    iVar2 = (int)lVar3;
  }
  bVar7 = iVar2 == len;
  if ((!bVar7) && (bVar6)) {
    bVar7 = str2[lVar3] == 0;
  }
  return bVar7;
}

Assistant:

bool equalsn(const char_type* str1, const char_type* str2, int len)
	{
		int i;
		for(i=0; str1[i] && str2[i] && i < len; ++i)
			if (str1[i] != str2[i])
				return false;

		// if one (or both) of the strings was smaller then they
		// are only equal if they have the same lenght
		return (i == len) || (str1[i] == 0 && str2[i] == 0);
	}